

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O1

uint __thiscall nv::DirectDrawSurface::blockSize(DirectDrawSurface *this)

{
  uint uVar1;
  
  uVar1 = (this->header).pf.fourcc;
  if ((int)uVar1 < 0x33545844) {
    if ((int)uVar1 < 0x32495441) {
      if ((uVar1 == 0x31495441) || (uVar1 == 0x31545844)) {
        return 8;
      }
    }
    else {
      if (uVar1 == 0x32495441) {
        return 0x10;
      }
      if (uVar1 == 0x32545844) {
        return 0x10;
      }
    }
  }
  else if ((int)uVar1 < 0x35545844) {
    if ((uVar1 == 0x33545844) || (uVar1 == 0x34545844)) {
      return 0x10;
    }
  }
  else {
    if (uVar1 == 0x42475852) {
      return 0x10;
    }
    if (uVar1 == 0x35545844) {
      return 0x10;
    }
  }
  return 0;
}

Assistant:

uint DirectDrawSurface::blockSize() const
{
	switch(header.pf.fourcc)
	{
		case FOURCC_DXT1:
		case FOURCC_ATI1:
			return 8;
		case FOURCC_DXT2:
		case FOURCC_DXT3:
		case FOURCC_DXT4:
		case FOURCC_DXT5:
		case FOURCC_RXGB:
		case FOURCC_ATI2:
			return 16;
	};

	// Not a block image.
	return 0;
}